

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_keytrans.cpp
# Opt level: O0

void __thiscall
Am_Input_Char::Am_Input_Char
          (Am_Input_Char *this,short c,bool shf,bool ctrl,bool mt,Am_Button_Down down,
          Am_Click_Count click,bool any_mod)

{
  bool bVar1;
  bool any_mod_local;
  Am_Button_Down down_local;
  bool mt_local;
  bool ctrl_local;
  bool shf_local;
  short c_local;
  Am_Input_Char *this_local;
  
  if ((char_map == (Am_Symbol_Table *)0x0) || (click_count_map == (Am_Symbol_Table *)0x0)) {
    Am_Initialize_Char_Map();
  }
  this->code = c;
  *(ushort *)&this->field_0x2 = *(ushort *)&this->field_0x2 & 0xfffe | (ushort)shf;
  *(ushort *)&this->field_0x2 = *(ushort *)&this->field_0x2 & 0xfffd | (ushort)ctrl << 1;
  *(ushort *)&this->field_0x2 = *(ushort *)&this->field_0x2 & 0xfffb | (ushort)mt << 2;
  *(ushort *)&this->field_0x2 = *(ushort *)&this->field_0x2 & 0xff0f | ((ushort)down & 0xf) << 4;
  *(ushort *)&this->field_0x2 = *(ushort *)&this->field_0x2 & 0xf0ff | ((ushort)click & 0xf) << 8;
  *(ushort *)&this->field_0x2 = *(ushort *)&this->field_0x2 & 0xfff7 | (ushort)any_mod << 3;
  if ((this->code < 0x61) || (0x7a < this->code)) {
    bVar1 = Fix_Shift_For_Code(this->code,(bool)((byte)*(undefined2 *)&this->field_0x2 & 1));
    *(ushort *)&this->field_0x2 = *(ushort *)&this->field_0x2 & 0xfffe | (ushort)bVar1;
  }
  else if ((*(ushort *)&this->field_0x2 & 1) != 0) {
    this->code = this->code + -0x20;
  }
  return;
}

Assistant:

Am_Input_Char::Am_Input_Char(short c, bool shf, bool ctrl, bool mt,
                             Am_Button_Down down, Am_Click_Count click,
                             bool any_mod)
{
  if (char_map == nullptr || click_count_map == nullptr)
    Am_Initialize_Char_Map();

  code = c;
  shift = shf;
  control = ctrl;
  meta = mt;
  button_down = down;
  click_count = click;
  any_modifier = any_mod;

  // make sure the shift bit is consistent with the character
  if ((code >= 'a') && (code <= 'z')) {

    if (shift) //convert to upper case
      code = code + ('A' - 'a');
  } else
    shift = Fix_Shift_For_Code(code, shift);
}